

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

int32 gauden_dist_precompute(gauden_t *g,float32 varfloor)

{
  int iVar1;
  float32 ***pppfVar2;
  double dVar3;
  uint local_3c;
  float *pfStack_38;
  int32 n;
  float32 *detp;
  float32 *varp;
  int32 flen;
  int32 d;
  int32 f;
  int32 m;
  int32 i;
  float32 varfloor_local;
  gauden_t *g_local;
  
  local_3c = 0;
  pppfVar2 = (float32 ***)
             __ckd_calloc_3d__((long)g->n_mgau,(long)g->n_feat,(long)g->n_density,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                               ,0x157);
  g->det = pppfVar2;
  for (d = 0; d < g->n_mgau; d = d + 1) {
    for (flen = 0; flen < g->n_feat; flen = flen + 1) {
      iVar1 = g->featlen[flen];
      varp._4_4_ = 0;
      pfStack_38 = (float *)g->det[d][flen];
      for (; varp._4_4_ < g->n_density; varp._4_4_ = varp._4_4_ + 1) {
        *pfStack_38 = 0.0;
        f = 0;
        detp = g->var[d][flen][varp._4_4_];
        for (; f < iVar1; f = f + 1) {
          if ((float)*detp < (float)varfloor) {
            *detp = varfloor;
            local_3c = local_3c + 1;
          }
          dVar3 = log((double)(float)*detp);
          *pfStack_38 = (float)dVar3 + *pfStack_38;
          *detp = (float32)(1.0 / ((float)*detp * 2.0));
          detp = detp + 1;
        }
        dVar3 = log(6.283185307179586);
        *pfStack_38 = (float)((double)iVar1 * dVar3) + *pfStack_38;
        *pfStack_38 = *pfStack_38 * 0.5;
        pfStack_38 = pfStack_38 + 1;
      }
    }
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,0x17f,"%d variance values floored\n",(ulong)local_3c);
  return 0;
}

Assistant:

int32
gauden_dist_precompute(gauden_t * g, float32 varfloor)
{
    int32 i, m, f, d, flen;
    float32 *varp, *detp;
    int32 n;

    n = 0;
    /* Allocate space for determinants */
    g->det =
        (float32 ***) ckd_calloc_3d(g->n_mgau, g->n_feat, g->n_density,
                                    sizeof(float32));

    /** FIX ME!, There is no removal of Gaussian in ms_mgau. This is
	not yet synchronized with cont_mgau's behavior. */

    for (m = 0; m < g->n_mgau; m++) {
        for (f = 0; f < g->n_feat; f++) {
            flen = g->featlen[f];

            /* Determinants for all variance vectors in g->[m][f] */
            for (d = 0, detp = g->det[m][f]; d < g->n_density; d++, detp++) {
                *detp = (float32) 0.0;

                for (i = 0, varp = g->var[m][f][d]; i < flen; i++, varp++) {
                    if (*varp < varfloor) {
#if 0
                        E_INFO
                            ("varp %f , floor %f n=%d, m %d, f %d c %d, i %d\n",
                             *varp, varfloor, n, m, f, d, i);
#endif
                        *varp = varfloor;
                        n++;
                    }

                    *detp += (float32) (log(*varp));

                    /* Precompute this part of the exponential */
                    *varp = (float32) (1.0 / (*varp * 2.0));
                }

                /* 2pi */
                *detp += (float32) (flen * log(2.0 * M_PI));

                /* Sqrt */
                *detp *= (float32) 0.5;
            }
        }
    }

    if (1)
        E_INFO("%d variance values floored\n", n);

    return 0;
}